

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper
          (PathTypeHandlerBase *this,Type *type,ObjectSlotAttributes *attributes,
          EquivalentPropertyEntry *entry)

{
  ushort uVar1;
  TypePath *this_00;
  bool bVar2;
  PropertyIndex index;
  ObjectSlotAttributes OVar3;
  ushort uVar4;
  
  index = TypePath::LookupInline
                    ((this->typePath).ptr,entry->propertyId,
                     (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
  if (index == 0xffff) {
    if ((entry->slotIndex != 0xffff) || (entry->mustBeWritable != false)) goto LAB_00dbd826;
LAB_00dbd81a:
    bVar2 = true;
  }
  else {
    if (attributes == (ObjectSlotAttributes *)0x0) {
      OVar3 = ObjectSlotAttr_Default;
LAB_00dbd7b2:
      uVar1 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
      uVar4 = -uVar1;
      if (index < uVar1) {
        uVar4 = (this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3;
      }
      if ((((ushort)(uVar4 + index) == entry->slotIndex) && (entry->isAuxSlot == uVar1 <= index)) &&
         ((entry->mustBeWritable != true ||
          (((OVar3 & ObjectSlotAttr_Writable) != ObjectSlotAttr_None &&
           ((DAT_015bf361 != '\x01' ||
            ((this_00 = (this->typePath).ptr, index < ((this_00->data).ptr)->maxInitializedLength &&
             (bVar2 = TypePath::GetIsFixedFieldAt
                                (this_00,index,
                                 (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1)), !bVar2)
             ))))))))) goto LAB_00dbd81a;
    }
    else {
      OVar3 = attributes[index];
      if ((OVar3 & ObjectSlotAttr_Deleted) == ObjectSlotAttr_None) {
        if ((OVar3 & ObjectSlotAttr_Accessor) == ObjectSlotAttr_None) goto LAB_00dbd7b2;
      }
      else if (entry->slotIndex == 0xffff) {
        return (bool)(entry->mustBeWritable ^ 1);
      }
    }
LAB_00dbd826:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper(const Type* type, const ObjectSlotAttributes * attributes, const EquivalentPropertyEntry *entry)
    {
        Js::PropertyIndex absSlotIndex = GetTypePath()->LookupInline(entry->propertyId, GetPathLength());

        if (absSlotIndex != Constants::NoSlot)
        {
            ObjectSlotAttributes attr = attributes ? attributes[absSlotIndex] : ObjectSlotAttr_Default;

            if (attr & ObjectSlotAttr_Deleted)
            {
                return entry->slotIndex == Constants::NoSlot && !entry->mustBeWritable;
            }

            if (attr & ObjectSlotAttr_Accessor)
            {
                return false;
            }

            Js::PropertyIndex relSlotIndex = AdjustValidSlotIndexForInlineSlots(absSlotIndex);
            if (relSlotIndex != entry->slotIndex || ((absSlotIndex >= GetInlineSlotCapacity()) != entry->isAuxSlot))
            {
                return false;
            }

            if (entry->mustBeWritable)
            {
                if (!(attr & ObjectSlotAttr_Writable))
                {
                    return false;
                }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
                int maxInitializedLength = this->GetTypePath()->GetMaxInitializedLength();
                if (FixPropsOnPathTypes() && (absSlotIndex >= maxInitializedLength || this->GetTypePath()->GetIsFixedFieldAt(absSlotIndex, this->GetPathLength())))
                {
                    return false;
                }
#endif
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }